

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LexerTests.cpp
# Opt level: O0

void testExpect(TokenKind kind)

{
  StringRef capturedExpression;
  StringRef capturedExpression_00;
  StringRef capturedExpression_01;
  StringRef capturedExpression_02;
  StringRef capturedExpression_03;
  StringRef capturedExpression_04;
  StringRef macroName;
  StringRef macroName_00;
  StringRef macroName_01;
  StringRef macroName_02;
  StringRef macroName_03;
  StringRef macroName_04;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> trivia;
  string_view rawText;
  Token lastConsumed;
  Token matchingDelim;
  bool bVar1;
  TokenKind in_DI;
  AssertionHandler catchAssertionHandler_5;
  AssertionHandler catchAssertionHandler_4;
  AssertionHandler catchAssertionHandler_3;
  AssertionHandler catchAssertionHandler_2;
  AssertionHandler catchAssertionHandler_1;
  AssertionHandler catchAssertionHandler;
  Token token;
  Token actual;
  ITransientExpression *pIVar2;
  SourceLineInfo *pSVar3;
  SmallVectorBase<slang::Diagnostic> *in_stack_fffffffffffffae0;
  SourceLocation *in_stack_fffffffffffffae8;
  undefined4 in_stack_fffffffffffffaf0;
  undefined4 uVar4;
  BufferID in_stack_fffffffffffffaf4;
  undefined4 uVar5;
  undefined8 in_stack_fffffffffffffaf8;
  undefined4 in_stack_fffffffffffffb00;
  int in_stack_fffffffffffffb04;
  ExprLhs<slang::parsing::TokenKind_&> *in_stack_fffffffffffffb08;
  Flags in_stack_fffffffffffffb10;
  undefined8 in_stack_fffffffffffffb18;
  TokenKind kind_00;
  undefined7 in_stack_fffffffffffffb20;
  undefined1 in_stack_fffffffffffffb27;
  Token *in_stack_fffffffffffffb28;
  SourceLocation in_stack_fffffffffffffb30;
  undefined8 in_stack_fffffffffffffb38;
  undefined7 in_stack_fffffffffffffb40;
  undefined1 in_stack_fffffffffffffb47;
  undefined7 in_stack_fffffffffffffb50;
  undefined1 in_stack_fffffffffffffb57;
  char *in_stack_fffffffffffffb58;
  string_view local_450;
  undefined1 local_439;
  StringRef local_438;
  SourceLineInfo local_428;
  StringRef local_418;
  TokenKind in_stack_fffffffffffffc06;
  Diagnostics *in_stack_fffffffffffffc08;
  BumpAllocator *in_stack_fffffffffffffc10;
  Token in_stack_fffffffffffffc18;
  size_t in_stack_fffffffffffffc40;
  Info *in_stack_fffffffffffffc48;
  undefined7 in_stack_fffffffffffffc50;
  undefined1 in_stack_fffffffffffffc57;
  Info *in_stack_fffffffffffffc58;
  SourceLineInfo local_398;
  StringRef local_388;
  undefined1 local_329;
  StringRef local_328;
  SourceLineInfo local_318;
  StringRef local_308;
  SourceLocation local_2b0 [2];
  unsigned_long local_2a0;
  StringRef local_268;
  SourceLineInfo local_258;
  StringRef local_248;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> local_1f0;
  undefined1 local_1d9;
  StringRef local_1d8;
  SourceLineInfo local_1c8;
  StringRef local_1b8;
  TokenKind *local_148;
  StringRef local_110;
  SourceLineInfo local_100;
  StringRef local_f0;
  ExprLhs<bool> *local_98;
  undefined8 local_90;
  size_t local_88;
  AssertionHandler *local_80;
  undefined8 local_78;
  undefined8 local_70;
  Token local_68;
  string_view local_58;
  BufferID local_44 [5];
  Token *local_30;
  undefined8 local_18;
  undefined8 local_10;
  TokenKind local_2;
  
  kind_00 = (TokenKind)((ulong)in_stack_fffffffffffffb18 >> 0x30);
  local_2 = in_DI;
  slang::SmallVectorBase<slang::Diagnostic>::clear(in_stack_fffffffffffffae0);
  std::span<const_slang::parsing::Trivia,_18446744073709551615UL>::span
            ((span<const_slang::parsing::Trivia,_18446744073709551615UL> *)0x5dfcfb);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)
             CONCAT44(in_stack_fffffffffffffaf4.id,in_stack_fffffffffffffaf0),
             (char *)in_stack_fffffffffffffae8);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)
             CONCAT44(in_stack_fffffffffffffaf4.id,in_stack_fffffffffffffaf0),
             (char *)in_stack_fffffffffffffae8);
  slang::BufferID::BufferID(local_44,1,local_58);
  slang::SourceLocation::SourceLocation
            (in_stack_fffffffffffffae8,in_stack_fffffffffffffaf4,(uint64_t)in_stack_fffffffffffffae0
            );
  trivia._M_extent._M_extent_value._0_7_ = in_stack_fffffffffffffb40;
  trivia._M_ptr = (pointer)in_stack_fffffffffffffb38;
  trivia._M_extent._M_extent_value._7_1_ = in_stack_fffffffffffffb47;
  rawText._M_len._7_1_ = in_stack_fffffffffffffb57;
  rawText._M_len._0_7_ = in_stack_fffffffffffffb50;
  rawText._M_str = in_stack_fffffffffffffb58;
  slang::parsing::Token::Token
            (in_stack_fffffffffffffb28,
             (BumpAllocator *)CONCAT17(in_stack_fffffffffffffb27,in_stack_fffffffffffffb20),kind_00,
             trivia,rawText,in_stack_fffffffffffffb30);
  local_78 = local_18;
  local_70 = local_10;
  slang::parsing::Token::Token(local_30);
  slang::parsing::Token::Token(local_30);
  uVar4 = (undefined4)local_90;
  uVar5 = (undefined4)((ulong)local_90 >> 0x20);
  lastConsumed.info = in_stack_fffffffffffffc48;
  lastConsumed.kind = (short)in_stack_fffffffffffffc40;
  lastConsumed._2_1_ = (char)(in_stack_fffffffffffffc40 >> 0x10);
  lastConsumed.numFlags.raw = (char)(in_stack_fffffffffffffc40 >> 0x18);
  lastConsumed.rawLen = (int)(in_stack_fffffffffffffc40 >> 0x20);
  matchingDelim.rawLen._3_1_ = in_stack_fffffffffffffc57;
  matchingDelim._0_7_ = in_stack_fffffffffffffc50;
  matchingDelim.info = in_stack_fffffffffffffc58;
  local_68 = slang::parsing::Token::createExpected
                       (in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,
                        in_stack_fffffffffffffc18,in_stack_fffffffffffffc06,lastConsumed,
                        matchingDelim);
  local_f0 = operator____catch_sr((char *)local_80,local_88);
  Catch::SourceLineInfo::SourceLineInfo
            (&local_100,
             "/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/tests/unittests/parsing/LexerTests.cpp"
             ,0x4ef);
  local_110 = operator____catch_sr((char *)local_80,local_88);
  pIVar2 = (ITransientExpression *)CONCAT44((int)(local_88 >> 0x20),2);
  macroName.m_size._0_4_ = in_stack_fffffffffffffb00;
  macroName.m_start = (char *)in_stack_fffffffffffffaf8;
  macroName.m_size._4_4_ = in_stack_fffffffffffffb04;
  capturedExpression.m_size._0_4_ = uVar4;
  capturedExpression.m_start = &local_98->m_lhs;
  capturedExpression.m_size._4_4_ = uVar5;
  Catch::AssertionHandler::AssertionHandler
            (local_80,macroName,(SourceLineInfo *)pIVar2,capturedExpression,
             in_stack_fffffffffffffb10);
  local_148 = (TokenKind *)
              Catch::operator<=<slang::parsing::TokenKind_&,_0>
                        ((Decomposer *)pIVar2,(TokenKind *)0x5dff18);
  Catch::operator==(in_stack_fffffffffffffb08,
                    (TokenKind *)CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00));
  Catch::AssertionHandler::handleExpr(local_80,pIVar2);
  Catch::AssertionHandler::complete(local_80);
  Catch::AssertionHandler::~AssertionHandler(local_80);
  local_1b8 = operator____catch_sr((char *)local_80,(size_t)pIVar2);
  Catch::SourceLineInfo::SourceLineInfo
            (&local_1c8,
             "/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/tests/unittests/parsing/LexerTests.cpp"
             ,0x4f0);
  local_1d8 = operator____catch_sr((char *)local_80,(size_t)pIVar2);
  pSVar3 = (SourceLineInfo *)CONCAT44((int)((ulong)pIVar2 >> 0x20),2);
  macroName_00.m_size._0_4_ = in_stack_fffffffffffffb00;
  macroName_00.m_start = (char *)in_stack_fffffffffffffaf8;
  macroName_00.m_size._4_4_ = in_stack_fffffffffffffb04;
  capturedExpression_00.m_size._0_4_ = uVar4;
  capturedExpression_00.m_start = &local_98->m_lhs;
  capturedExpression_00.m_size._4_4_ = uVar5;
  Catch::AssertionHandler::AssertionHandler
            (local_80,macroName_00,pSVar3,capturedExpression_00,in_stack_fffffffffffffb10);
  local_1f0 = slang::parsing::Token::trivia
                        ((Token *)CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00));
  std::span<const_slang::parsing::Trivia,_18446744073709551615UL>::empty
            ((span<const_slang::parsing::Trivia,_18446744073709551615UL> *)0x5e00ae);
  local_1d9 = Catch::operator<=<bool,_0>((Decomposer *)pSVar3,false);
  Catch::AssertionHandler::handleExpr<bool>((AssertionHandler *)CONCAT44(uVar5,uVar4),local_98);
  Catch::AssertionHandler::complete(local_80);
  Catch::AssertionHandler::~AssertionHandler(local_80);
  local_248 = operator____catch_sr((char *)local_80,(size_t)pSVar3);
  Catch::SourceLineInfo::SourceLineInfo
            (&local_258,
             "/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/tests/unittests/parsing/LexerTests.cpp"
             ,0x4f1);
  local_268 = operator____catch_sr((char *)local_80,(size_t)pSVar3);
  pIVar2 = (ITransientExpression *)CONCAT44((int)((ulong)pSVar3 >> 0x20),2);
  macroName_01.m_size._0_4_ = in_stack_fffffffffffffb00;
  macroName_01.m_start = (char *)in_stack_fffffffffffffaf8;
  macroName_01.m_size._4_4_ = in_stack_fffffffffffffb04;
  capturedExpression_01.m_size._0_4_ = uVar4;
  capturedExpression_01.m_start = &local_98->m_lhs;
  capturedExpression_01.m_size._4_4_ = uVar5;
  Catch::AssertionHandler::AssertionHandler
            (local_80,macroName_01,(SourceLineInfo *)pIVar2,capturedExpression_01,
             in_stack_fffffffffffffb10);
  local_2b0[0] = slang::parsing::Token::location(&local_68);
  slang::SourceLocation::offset(local_2b0);
  local_2a0 = (unsigned_long)Catch::operator<=<unsigned_long,_0>((Decomposer *)pIVar2,0x5e027e);
  Catch::operator==((ExprLhs<unsigned_long> *)in_stack_fffffffffffffb08,in_stack_fffffffffffffb04);
  Catch::AssertionHandler::handleExpr(local_80,pIVar2);
  Catch::AssertionHandler::complete(local_80);
  Catch::AssertionHandler::~AssertionHandler(local_80);
  local_308 = operator____catch_sr((char *)local_80,(size_t)pIVar2);
  Catch::SourceLineInfo::SourceLineInfo
            (&local_318,
             "/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/tests/unittests/parsing/LexerTests.cpp"
             ,0x4f2);
  local_328 = operator____catch_sr((char *)local_80,(size_t)pIVar2);
  pSVar3 = (SourceLineInfo *)CONCAT44((int)((ulong)pIVar2 >> 0x20),2);
  macroName_02.m_size._0_4_ = in_stack_fffffffffffffb00;
  macroName_02.m_start = (char *)in_stack_fffffffffffffaf8;
  macroName_02.m_size._4_4_ = in_stack_fffffffffffffb04;
  capturedExpression_02.m_size._0_4_ = uVar4;
  capturedExpression_02.m_start = &local_98->m_lhs;
  capturedExpression_02.m_size._4_4_ = uVar5;
  Catch::AssertionHandler::AssertionHandler
            (local_80,macroName_02,pSVar3,capturedExpression_02,in_stack_fffffffffffffb10);
  slang::parsing::Token::isMissing(&local_68);
  local_329 = Catch::operator<=<bool,_0>((Decomposer *)pSVar3,false);
  Catch::AssertionHandler::handleExpr<bool>((AssertionHandler *)CONCAT44(uVar5,uVar4),local_98);
  Catch::AssertionHandler::complete(local_80);
  Catch::AssertionHandler::~AssertionHandler(local_80);
  bVar1 = slang::parsing::LexerFacts::isKeyword(local_2);
  if (!bVar1) {
    local_388 = operator____catch_sr((char *)local_80,(size_t)pSVar3);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_398,
               "/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/tests/unittests/parsing/LexerTests.cpp"
               ,0x4f5);
    operator____catch_sr((char *)local_80,(size_t)pSVar3);
    pSVar3 = (SourceLineInfo *)CONCAT44((int)((ulong)pSVar3 >> 0x20),2);
    macroName_03.m_size._0_4_ = in_stack_fffffffffffffb00;
    macroName_03.m_start = (char *)in_stack_fffffffffffffaf8;
    macroName_03.m_size._4_4_ = in_stack_fffffffffffffb04;
    capturedExpression_03.m_size._0_4_ = uVar4;
    capturedExpression_03.m_start = &local_98->m_lhs;
    capturedExpression_03.m_size._4_4_ = uVar5;
    Catch::AssertionHandler::AssertionHandler
              (local_80,macroName_03,pSVar3,capturedExpression_03,in_stack_fffffffffffffb10);
    slang::parsing::Token::valueText((Token *)CONCAT44(uVar5,uVar4));
    std::basic_string_view<char,_std::char_traits<char>_>::empty
              ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xfffffffffffffc40);
    Catch::operator<=<bool,_0>((Decomposer *)pSVar3,false);
    Catch::AssertionHandler::handleExpr<bool>((AssertionHandler *)CONCAT44(uVar5,uVar4),local_98);
    Catch::AssertionHandler::complete(local_80);
    Catch::AssertionHandler::~AssertionHandler(local_80);
    local_418 = operator____catch_sr((char *)local_80,(size_t)pSVar3);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_428,
               "/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/tests/unittests/parsing/LexerTests.cpp"
               ,0x4f6);
    local_438 = operator____catch_sr((char *)local_80,(size_t)pSVar3);
    pSVar3 = (SourceLineInfo *)CONCAT44((int)((ulong)pSVar3 >> 0x20),2);
    macroName_04.m_size._0_4_ = in_stack_fffffffffffffb00;
    macroName_04.m_start = (char *)in_stack_fffffffffffffaf8;
    macroName_04.m_size._4_4_ = in_stack_fffffffffffffb04;
    capturedExpression_04.m_size._0_4_ = uVar4;
    capturedExpression_04.m_start = &local_98->m_lhs;
    capturedExpression_04.m_size._4_4_ = uVar5;
    Catch::AssertionHandler::AssertionHandler
              (local_80,macroName_04,pSVar3,capturedExpression_04,in_stack_fffffffffffffb10);
    local_450 = slang::parsing::Token::rawText((Token *)CONCAT44(uVar5,uVar4));
    std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_450);
    local_439 = Catch::operator<=<bool,_0>((Decomposer *)pSVar3,false);
    Catch::AssertionHandler::handleExpr<bool>((AssertionHandler *)CONCAT44(uVar5,uVar4),local_98);
    Catch::AssertionHandler::complete(local_80);
    Catch::AssertionHandler::~AssertionHandler(local_80);
  }
  return;
}

Assistant:

void testExpect(TokenKind kind) {
    diagnostics.clear();
    Token actual(alloc, TokenKind::Identifier, {}, "SDF", SourceLocation(BufferID(1, "asdf"), 5));
    Token token = Token::createExpected(alloc, diagnostics, actual, kind, Token(), Token());

    CHECK(token.kind == kind);
    CHECK(token.trivia().empty());
    CHECK(token.location().offset() == 5);
    CHECK(token.isMissing());

    if (!LF::isKeyword(kind)) {
        CHECK(token.valueText().empty());
        CHECK(token.rawText().empty());
    }
}